

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.cpp
# Opt level: O0

bool Imath_3_2::(anonymous_namespace)::twoSidedJacobiRotation<double,1,2,0>
               (Matrix33<double> *A,Matrix33<double> *U,Matrix33<double> *V,double tol)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  double *pdVar4;
  int __x;
  Matrix33<double> *in_RDI;
  Matrix33<double> *pMVar5;
  double in_XMM0_Qa;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  Matrix33<double> *extraout_XMM0_Qa_03;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double tau2_1;
  double tau1_1;
  double tau2;
  double tau1;
  double d_2;
  double d_1;
  double s_1;
  double c_1;
  double t_2;
  double rho_2;
  double s_2;
  double c_2;
  double rho;
  double r;
  double p;
  double s;
  double c;
  double mu_2;
  double mu_1;
  bool changed;
  double z;
  double y;
  double x;
  double w;
  Matrix33<double> *in_stack_fffffffffffffef0;
  double local_a8;
  double local_98;
  double local_90;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  
  pdVar4 = Matrix33<double>::operator[](in_RDI,1);
  dVar9 = pdVar4[1];
  pdVar4 = Matrix33<double>::operator[](in_RDI,1);
  dVar1 = pdVar4[2];
  pdVar4 = Matrix33<double>::operator[](in_RDI,2);
  dVar8 = pdVar4[1];
  pMVar5 = in_RDI;
  pdVar4 = Matrix33<double>::operator[](in_RDI,2);
  dVar2 = pdVar4[2];
  bVar3 = false;
  __x = (int)pMVar5;
  std::abs(__x);
  std::abs(__x);
  if (in_XMM0_Qa * extraout_XMM0_Qa_00 < extraout_XMM0_Qa) {
    local_68 = (dVar9 + dVar2) / (dVar1 - dVar8);
    local_70 = sqrt(local_68 * local_68 + 1.0);
    local_70 = 1.0 / local_70;
    if (local_68 < 0.0) {
      local_70 = -local_70;
    }
    local_68 = local_70 * local_68;
    local_58 = local_70 * (dVar1 + dVar8) + local_68 * (dVar2 - dVar9);
    local_60 = (local_68 * dVar1 + -(local_70 * dVar2)) * 2.0;
    bVar3 = true;
  }
  else {
    local_68 = 1.0;
    local_70 = 0.0;
    local_58 = dVar2 - dVar9;
    local_60 = dVar1 + dVar8;
  }
  std::abs(__x);
  std::abs(__x);
  if (in_XMM0_Qa * extraout_XMM0_Qa_02 < extraout_XMM0_Qa_01) {
    local_58 = local_58 / local_60;
    std::abs(__x);
    in_stack_fffffffffffffef0 = extraout_XMM0_Qa_03;
    dVar6 = sqrt(local_58 * local_58 + 1.0);
    local_a8 = 1.0 / ((double)in_stack_fffffffffffffef0 + dVar6);
    if (local_58 < 0.0) {
      local_a8 = -local_a8;
    }
    local_90 = sqrt(local_a8 * local_a8 + 1.0);
    local_90 = 1.0 / local_90;
    local_98 = local_90 * local_a8;
    bVar3 = true;
  }
  else {
    local_90 = 1.0;
    local_98 = 0.0;
  }
  dVar6 = local_90 * local_68 + -(local_98 * local_70);
  dVar7 = local_98 * local_68 + local_90 * local_70;
  if (bVar3) {
    pdVar4 = Matrix33<double>::operator[](in_RDI,1);
    pdVar4[1] = dVar6 * (dVar9 * local_90 + -(dVar1 * local_98)) +
                -(dVar7 * (dVar8 * local_90 + -(dVar2 * local_98)));
    pdVar4 = Matrix33<double>::operator[](in_RDI,2);
    pdVar4[2] = dVar7 * (dVar9 * local_98 + dVar1 * local_90) +
                dVar6 * (dVar8 * local_98 + dVar2 * local_90);
    pdVar4 = Matrix33<double>::operator[](in_RDI,2);
    pdVar4[1] = 0.0;
    pdVar4 = Matrix33<double>::operator[](in_RDI,1);
    pdVar4[2] = 0.0;
    pdVar4 = Matrix33<double>::operator[](in_RDI,1);
    dVar9 = *pdVar4;
    pdVar4 = Matrix33<double>::operator[](in_RDI,2);
    dVar1 = *pdVar4;
    pdVar4 = Matrix33<double>::operator[](in_RDI,1);
    *pdVar4 = dVar6 * dVar9 + -(dVar7 * dVar1);
    pdVar4 = Matrix33<double>::operator[](in_RDI,2);
    *pdVar4 = dVar7 * dVar9 + dVar6 * dVar1;
    pdVar4 = Matrix33<double>::operator[](in_RDI,0);
    dVar9 = pdVar4[1];
    pdVar4 = Matrix33<double>::operator[](in_RDI,0);
    dVar1 = pdVar4[2];
    dVar8 = local_90 * dVar9 + -(local_98 * dVar1);
    pdVar4 = Matrix33<double>::operator[](in_RDI,0);
    pdVar4[1] = dVar8;
    dVar9 = local_98 * dVar9 + local_90 * dVar1;
    pdVar4 = Matrix33<double>::operator[](in_RDI,0);
    pdVar4[2] = dVar9;
    jacobiRotateRight<double,1,2>(in_stack_fffffffffffffef0,dVar9,dVar8);
    jacobiRotateRight<double,1,2>(in_stack_fffffffffffffef0,dVar9,dVar8);
  }
  else {
    pdVar4 = Matrix33<double>::operator[](in_RDI,2);
    pdVar4[1] = 0.0;
    pdVar4 = Matrix33<double>::operator[](in_RDI,1);
    pdVar4[2] = 0.0;
  }
  return bVar3;
}

Assistant:

bool
twoSidedJacobiRotation (
    IMATH_INTERNAL_NAMESPACE::Matrix33<T>& A,
    IMATH_INTERNAL_NAMESPACE::Matrix33<T>& U,
    IMATH_INTERNAL_NAMESPACE::Matrix33<T>& V,
    const T                                tol)
{
    // Load everything into local variables to make things easier on the
    // optimizer:
    const T w = A[j][j];
    const T x = A[j][k];
    const T y = A[k][j];
    const T z = A[k][k];

    // We will keep track of whether we're actually performing any rotations,
    // since if the matrix is already diagonal we'll end up with the identity
    // as our Jacobi rotation and we can short-circuit.
    bool changed = false;

    // The first step is to symmetrize the 2x2 matrix,
    //   [ c  s ]^T [ w x ] = [ p q ]
    //   [ -s c ]   [ y z ]   [ q r ]
    T mu_1 = w + z;
    T mu_2 = x - y;

    T c, s;
    if (std::abs (mu_2) <=
        tol * std::abs (mu_1)) // Already symmetric (to tolerance)
    {                          // Note that the <= is important here
        c = T (1);             // because we want to bypass the computation
        s = T (0);             // of rho if mu_1 = mu_2 = 0.

        const T p = w;
        const T r = z;
        mu_1      = r - p;
        mu_2      = x + y;
    }
    else
    {
        // TODO is there a native inverse square root function?
        const T rho = mu_1 / mu_2;

        s = T (1) / std::sqrt (T (1) + rho * rho);
        if (rho < 0) s = -s;
        c = s * rho;

        mu_1 = s * (x + y) + c * (z - w); // = r - p
        mu_2 = T (2) * (c * x - s * z);   // = 2*q

        changed = true;
    }

    // The second stage diagonalizes,
    //   [ c2   s2 ]^T [ p q ] [ c2  s2 ]  = [ d1   0 ]
    //   [ -s2  c2 ]   [ q r ] [ -s2 c2 ]    [  0  d2 ]
    T c_2, s_2;
    if (std::abs (mu_2) <= tol * std::abs (mu_1))
    {
        c_2 = T (1);
        s_2 = T (0);
    }
    else
    {
        const T rho_2 = mu_1 / mu_2;
        T t_2 = T (1) / (std::abs (rho_2) + std::sqrt (1 + rho_2 * rho_2));
        if (rho_2 < 0) t_2 = -t_2;
        c_2 = T (1) / std::sqrt (T (1) + t_2 * t_2);
        s_2 = c_2 * t_2;

        changed = true;
    }

    const T c_1 = c_2 * c - s_2 * s;
    const T s_1 = s_2 * c + c_2 * s;

    if (!changed)
    {
        // We've decided that the off-diagonal entries are already small
        // enough, so we'll set them to zero.  This actually appears to result
        // in smaller errors than leaving them be, possibly because it prevents
        // us from trying to do extra rotations later that we don't need.
        A[k][j] = 0;
        A[j][k] = 0;
        return false;
    }

    const T d_1 = c_1 * (w * c_2 - x * s_2) - s_1 * (y * c_2 - z * s_2);
    const T d_2 = s_1 * (w * s_2 + x * c_2) + c_1 * (y * s_2 + z * c_2);

    // For the entries we just zeroed out, we'll just set them to 0, since
    // they should be 0 up to machine precision.
    A[j][j] = d_1;
    A[k][k] = d_2;
    A[k][j] = 0;
    A[j][k] = 0;

    // Rotate the entries that _weren't_ involved in the 2x2 SVD:
    {
        // Rotate on the left by
        //    [  c1 s1 0 ]^T      [  c1 0 s1 ]^T      [ 1   0  0 ]^T
        //    [ -s1 c1 0 ]    or  [   0 1  0 ]    or  [ 0  c1 s1 ]
        //    [   0  0 1 ]        [ -s1 0 c1 ]        [ 0 -s1 c1 ]
        // This has the effect of adding the (weighted) ith and jth _rows_ to
        // each other.
        const T tau1 = A[j][l];
        const T tau2 = A[k][l];
        A[j][l]      = c_1 * tau1 - s_1 * tau2;
        A[k][l]      = s_1 * tau1 + c_1 * tau2;
    }

    {
        // Rotate on the right by
        //    [  c2 s2 0 ]      [  c2 0 s2 ]      [ 1   0  0 ]
        //    [ -s2 c2 0 ]  or  [   0 1  0 ]  or  [ 0  c2 s2 ]
        //    [   0  0 1 ]      [ -s2 0 c2 ]      [ 0 -s2 c2 ]
        // This has the effect of adding the (weighted) ith and jth _columns_ to
        // each other.
        const T tau1 = A[l][j];
        const T tau2 = A[l][k];
        A[l][j]      = c_2 * tau1 - s_2 * tau2;
        A[l][k]      = s_2 * tau1 + c_2 * tau2;
    }

    // Now apply the rotations to U and V:
    // Remember that we have
    //    R1^T * A * R2 = D
    // This is in the 2x2 case, but after doing a bunch of these
    // we will get something like this for the 3x3 case:
    //   ... R1b^T * R1a^T * A * R2a * R2b * ... = D
    //   -----------------       ---------------
    //        = U^T                    = V
    // So,
    //   U = R1a * R1b * ...
    //   V = R2a * R2b * ...
    jacobiRotateRight<T, j, k> (U, c_1, s_1);
    jacobiRotateRight<T, j, k> (V, c_2, s_2);

    return true;
}